

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::BeginDragDropSource(ImGuiDragDropFlags flags)

{
  ImGuiItemStatusFlags *pIVar1;
  ImRect *r_abs;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  ImGuiID id;
  ImGuiContext *g;
  int iVar7;
  uint uVar8;
  int iVar9;
  
  pIVar4 = GImGui;
  if ((flags & 0x10U) == 0) {
    pIVar3 = GImGui->CurrentWindow;
    id = (GImGui->LastItemData).ID;
    if (id == 0) {
      if (((GImGui->IO).MouseDown[0] != false) && (pIVar3->SkipItems == false)) {
        if (((GImGui->LastItemData).StatusFlags & 1) == 0) {
          if (GImGui->ActiveId != 0) {
            iVar9 = 0;
            if (((flags & 8U) == 0) || (iVar9 = 0, GImGui->ActiveIdWindow != pIVar3))
            goto LAB_0011f367;
LAB_0011f3a8:
            r_abs = &(GImGui->LastItemData).Rect;
            id = ImGuiWindow::GetIDFromRectangle(pIVar3,r_abs);
            (pIVar4->LastItemData).ID = id;
            bVar6 = ItemHoverable(r_abs,id);
            if ((bVar6) && ((pIVar4->IO).MouseClicked[0] == true)) {
              SetActiveID(id,pIVar3);
              FocusWindow(pIVar3);
            }
            iVar7 = 0;
            if (pIVar4->ActiveId == id) goto LAB_0011f21c;
            goto LAB_0011f224;
          }
        }
        else if ((flags & 8U) != 0) goto LAB_0011f3a8;
      }
    }
    else {
      iVar9 = 0;
      if (GImGui->ActiveId != id) goto LAB_0011f367;
      iVar7 = GImGui->ActiveIdMouseButton;
      if (GImGui->ActiveIdMouseButton == -1) {
        iVar7 = iVar9;
      }
      if ((GImGui->IO).MouseDown[iVar7] == false) goto LAB_0011f367;
      bVar6 = false;
      iVar9 = 0;
      if (pIVar3->SkipItems != false) goto LAB_0011f367;
LAB_0011f21c:
      pIVar4->ActiveIdAllowOverlap = bVar6;
LAB_0011f224:
      pIVar5 = GImGui;
      if (pIVar4->ActiveId == id) {
        if ((GImGui->IO).MouseDown[iVar7] == true) {
          fVar2 = (GImGui->IO).MouseDragThreshold;
          bVar6 = fVar2 * fVar2 <= (GImGui->IO).MouseDragMaxDistanceSqr[iVar7];
        }
        else {
          bVar6 = false;
        }
        uVar8 = (pIVar3->IDStack).Data[(long)(pIVar3->IDStack).Size + -1];
        (GImGui->ActiveIdUsingKeyInputMask).Storage[1] = 0xffffffff;
        (pIVar5->ActiveIdUsingKeyInputMask).Storage[2] = 0xffffffff;
        (pIVar5->ActiveIdUsingKeyInputMask).Storage[3] = 0xffffffff;
        (pIVar5->ActiveIdUsingKeyInputMask).Storage[4] = 0xffffffff;
        pIVar5->ActiveIdUsingNavDirMask = 0xffffffff;
        pIVar5->ActiveIdUsingNavInputMask = 0xffffffff;
        (pIVar5->ActiveIdUsingKeyInputMask).Storage[0] = 0xffffffff;
        (pIVar5->ActiveIdUsingKeyInputMask).Storage[1] = 0xffffffff;
        pIVar5->NavMoveSubmitted = false;
        pIVar5->NavMoveScoringItems = false;
        pIVar5->NavAnyRequest = pIVar5->NavInitRequest;
        goto LAB_0011f28f;
      }
    }
  }
  else {
    uVar8 = 0;
    id = ImHashStr("#SourceExtern",0,0);
    bVar6 = true;
    iVar7 = 0;
LAB_0011f28f:
    if (bVar6) {
      if (pIVar4->DragDropActive == false) {
        ClearDragDrop();
        (pIVar4->DragDropPayload).SourceId = id;
        (pIVar4->DragDropPayload).SourceParentId = uVar8;
        pIVar4->DragDropActive = true;
        pIVar4->DragDropSourceFlags = flags;
        pIVar4->DragDropMouseButton = iVar7;
        if (id == pIVar4->ActiveId) {
          pIVar4->ActiveIdNoClearOnFocusLoss = true;
        }
      }
      pIVar4->DragDropSourceFrameCount = pIVar4->FrameCount;
      pIVar4->DragDropWithinSource = true;
      if ((((flags & 1U) == 0) && (BeginTooltipEx(0,0), pIVar4->DragDropAcceptIdPrev != 0)) &&
         ((pIVar4->DragDropAcceptFlags & 0x1000) != 0)) {
        pIVar3 = pIVar4->CurrentWindow;
        pIVar3->SkipItems = true;
        pIVar3->Hidden = true;
        pIVar3->HiddenFramesCanSkipItems = '\x01';
      }
      iVar9 = 1;
      if ((flags & 0x12U) == 0) {
        pIVar1 = &(pIVar4->LastItemData).StatusFlags;
        *(byte *)pIVar1 = (byte)*pIVar1 & 0xfe;
      }
      goto LAB_0011f367;
    }
  }
  iVar9 = 0;
LAB_0011f367:
  return SUB41(iVar9,0);
}

Assistant:

bool ImGui::BeginDragDropSource(ImGuiDragDropFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // FIXME-DRAGDROP: While in the common-most "drag from non-zero active id" case we can tell the mouse button,
    // in both SourceExtern and id==0 cases we may requires something else (explicit flags or some heuristic).
    ImGuiMouseButton mouse_button = ImGuiMouseButton_Left;

    bool source_drag_active = false;
    ImGuiID source_id = 0;
    ImGuiID source_parent_id = 0;
    if (!(flags & ImGuiDragDropFlags_SourceExtern))
    {
        source_id = g.LastItemData.ID;
        if (source_id != 0)
        {
            // Common path: items with ID
            if (g.ActiveId != source_id)
                return false;
            if (g.ActiveIdMouseButton != -1)
                mouse_button = g.ActiveIdMouseButton;
            if (g.IO.MouseDown[mouse_button] == false || window->SkipItems)
                return false;
            g.ActiveIdAllowOverlap = false;
        }
        else
        {
            // Uncommon path: items without ID
            if (g.IO.MouseDown[mouse_button] == false || window->SkipItems)
                return false;
            if ((g.LastItemData.StatusFlags & ImGuiItemStatusFlags_HoveredRect) == 0 && (g.ActiveId == 0 || g.ActiveIdWindow != window))
                return false;

            // If you want to use BeginDragDropSource() on an item with no unique identifier for interaction, such as Text() or Image(), you need to:
            // A) Read the explanation below, B) Use the ImGuiDragDropFlags_SourceAllowNullID flag.
            if (!(flags & ImGuiDragDropFlags_SourceAllowNullID))
            {
                IM_ASSERT(0);
                return false;
            }

            // Magic fallback to handle items with no assigned ID, e.g. Text(), Image()
            // We build a throwaway ID based on current ID stack + relative AABB of items in window.
            // THE IDENTIFIER WON'T SURVIVE ANY REPOSITIONING/RESIZINGG OF THE WIDGET, so if your widget moves your dragging operation will be canceled.
            // We don't need to maintain/call ClearActiveID() as releasing the button will early out this function and trigger !ActiveIdIsAlive.
            // Rely on keeping other window->LastItemXXX fields intact.
            source_id = g.LastItemData.ID = window->GetIDFromRectangle(g.LastItemData.Rect);
            bool is_hovered = ItemHoverable(g.LastItemData.Rect, source_id);
            if (is_hovered && g.IO.MouseClicked[mouse_button])
            {
                SetActiveID(source_id, window);
                FocusWindow(window);
            }
            if (g.ActiveId == source_id) // Allow the underlying widget to display/return hovered during the mouse release frame, else we would get a flicker.
                g.ActiveIdAllowOverlap = is_hovered;
        }
        if (g.ActiveId != source_id)
            return false;
        source_parent_id = window->IDStack.back();
        source_drag_active = IsMouseDragging(mouse_button);

        // Disable navigation and key inputs while dragging + cancel existing request if any
        SetActiveIdUsingNavAndKeys();
    }
    else
    {
        window = NULL;
        source_id = ImHashStr("#SourceExtern");
        source_drag_active = true;
    }

    if (source_drag_active)
    {
        if (!g.DragDropActive)
        {
            IM_ASSERT(source_id != 0);
            ClearDragDrop();
            ImGuiPayload& payload = g.DragDropPayload;
            payload.SourceId = source_id;
            payload.SourceParentId = source_parent_id;
            g.DragDropActive = true;
            g.DragDropSourceFlags = flags;
            g.DragDropMouseButton = mouse_button;
            if (payload.SourceId == g.ActiveId)
                g.ActiveIdNoClearOnFocusLoss = true;
        }
        g.DragDropSourceFrameCount = g.FrameCount;
        g.DragDropWithinSource = true;

        if (!(flags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
        {
            // Target can request the Source to not display its tooltip (we use a dedicated flag to make this request explicit)
            // We unfortunately can't just modify the source flags and skip the call to BeginTooltip, as caller may be emitting contents.
            BeginTooltip();
            if (g.DragDropAcceptIdPrev && (g.DragDropAcceptFlags & ImGuiDragDropFlags_AcceptNoPreviewTooltip))
            {
                ImGuiWindow* tooltip_window = g.CurrentWindow;
                tooltip_window->Hidden = tooltip_window->SkipItems = true;
                tooltip_window->HiddenFramesCanSkipItems = 1;
            }
        }

        if (!(flags & ImGuiDragDropFlags_SourceNoDisableHover) && !(flags & ImGuiDragDropFlags_SourceExtern))
            g.LastItemData.StatusFlags &= ~ImGuiItemStatusFlags_HoveredRect;

        return true;
    }
    return false;
}